

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# squtils.h
# Opt level: O3

void __thiscall
sqvector<SQOptimizer::Jump,_unsigned_int>::resize
          (sqvector<SQOptimizer::Jump,_unsigned_int> *this,size_type newsize,Jump *fill)

{
  Jump *pJVar1;
  JumpArg JVar2;
  undefined2 uVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  uint uVar7;
  Jump *pJVar8;
  
  if (this->_allocated < newsize) {
    pJVar8 = (Jump *)sq_vm_realloc(this->_alloc_ctx,this->_vals,(ulong)this->_allocated * 0x14,
                                   (ulong)newsize * 0x14);
    this->_vals = pJVar8;
    this->_allocated = newsize;
  }
  uVar7 = this->_size;
  if (uVar7 < newsize) {
    do {
      pJVar8 = this->_vals;
      JVar2 = fill->jumpArg;
      uVar3 = *(undefined2 *)&fill->field_0x12;
      pJVar1 = pJVar8 + uVar7;
      pJVar1->modified = fill->modified;
      pJVar1->jumpArg = JVar2;
      *(undefined2 *)&pJVar1->field_0x12 = uVar3;
      iVar4 = fill->instructionIndex;
      iVar5 = fill->originalJumpTo;
      iVar6 = fill->jumpTo;
      pJVar8 = pJVar8 + uVar7;
      pJVar8->originalInstructionIndex = fill->originalInstructionIndex;
      pJVar8->instructionIndex = iVar4;
      pJVar8->originalJumpTo = iVar5;
      pJVar8->jumpTo = iVar6;
      uVar7 = this->_size + 1;
      this->_size = uVar7;
    } while (uVar7 < newsize);
  }
  else {
    this->_size = newsize;
  }
  return;
}

Assistant:

void resize(size_type newsize, const T& fill = T())
    {
        if(newsize > _allocated)
            _realloc(newsize);
        if(newsize > _size) {
            while(_size < newsize) {
                new ((void *)&_vals[_size]) T(fill);
                _size++;
            }
        }
        else{
            for(size_type i = newsize; i < _size; i++) {
                _vals[i].~T();
            }
            _size = newsize;
        }
    }